

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockInference.cpp
# Opt level: O1

void __thiscall
slang::analysis::SampledValueFuncVisitor::visit<slang::ast::ReplicatedAssignmentPatternExpression>
          (SampledValueFuncVisitor *this,ReplicatedAssignmentPatternExpression *expr)

{
  pointer ppEVar1;
  size_t sVar2;
  Expression *this_00;
  bool bVar3;
  KnownSystemName KVar4;
  Diagnostic *this_01;
  long lVar5;
  string_view arg;
  long lStack_30;
  
  bVar3 = ClockInference::isSampledValueFuncCall((Expression *)expr);
  if (bVar3) {
    KVar4 = ast::CallExpression::getKnownSystemName((CallExpression *)expr);
    ppEVar1 = expr[1].super_AssignmentPatternExpressionBase.elements_._M_ptr;
    if (KVar4 == Past) {
      if (ppEVar1 != (pointer)0x4) goto LAB_0014b030;
      lStack_30 = 0x18;
    }
    else {
      if (ppEVar1 != (pointer)0x2) goto LAB_0014b030;
      lStack_30 = 8;
    }
    if (**(int **)((long)expr[1].super_AssignmentPatternExpressionBase.super_Expression.sourceRange.
                         endLoc + lStack_30) == 0x1e) {
LAB_0014b030:
      this_01 = AnalysisContext::addDiag
                          (this->context,this->parentSymbol,(DiagCode)0x8000e,
                           (expr->super_AssignmentPatternExpressionBase).super_Expression.
                           sourceRange);
      arg = ast::CallExpression::getSubroutineName((CallExpression *)expr);
      Diagnostic::operator<<(this_01,arg);
      return;
    }
  }
  else {
    ast::Expression::
    visitExpression<slang::ast::Expression_const,slang::analysis::SampledValueFuncVisitor&>
              (expr->count_,expr->count_,this);
    sVar2 = (expr->super_AssignmentPatternExpressionBase).elements_._M_extent._M_extent_value;
    if (sVar2 != 0) {
      ppEVar1 = (expr->super_AssignmentPatternExpressionBase).elements_._M_ptr;
      lVar5 = 0;
      do {
        this_00 = *(Expression **)((long)ppEVar1 + lVar5);
        ast::Expression::
        visitExpression<slang::ast::Expression_const,slang::analysis::SampledValueFuncVisitor&>
                  (this_00,this_00,this);
        lVar5 = lVar5 + 8;
      } while (sVar2 << 3 != lVar5);
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (ClockInference::isSampledValueFuncCall(expr)) {
                auto& call = expr.template as<CallExpression>();
                bool hasClock;
                if (call.getKnownSystemName() == KnownSystemName::Past) {
                    hasClock = call.arguments().size() == 4 &&
                               call.arguments()[3]->kind != ExpressionKind::EmptyArgument;
                }
                else {
                    hasClock = call.arguments().size() == 2 &&
                               call.arguments()[1]->kind != ExpressionKind::EmptyArgument;
                }

                if (!hasClock) {
                    context.addDiag(parentSymbol, diag::SampledValueFuncClock, call.sourceRange)
                        << call.getSubroutineName();
                }
            }
            else if constexpr (HasVisitExprs<T, SampledValueFuncVisitor>) {
                expr.visitExprs(*this);
            }
        }
    }